

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O2

void compute_repair(string *in)

{
  ll_el<unsigned_int,_unsigned_int> el;
  cpair cVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  cpair cVar6;
  uint64_t uVar7;
  cpair cVar8;
  cpair cVar9;
  ulong uVar10;
  cpair cVar11;
  uint uVar12;
  uint64_t i;
  ulong uVar13;
  int iVar14;
  uint64_t i_1;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  itype iVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auVar21 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar23 [64];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  char c;
  uint local_59c;
  double local_598;
  uint local_590;
  uint uStack_58c;
  int iStack_588;
  uint uStack_584;
  uint local_580;
  ulong local_578;
  itype null;
  TP_t TP;
  vector<unsigned_int,_std::allocator<unsigned_int>_> char_to_int;
  text_t T;
  hf_q_t local_4a8;
  lf_q_t LFQ;
  ifstream ifs;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  
  null = 0xffffffff;
  std::ifstream::ifstream(&ifs,(string *)in,_S_in);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&char_to_int,0x100,&null,(allocator_type *)&LFQ);
  std::ifstream::ifstream(&LFQ,(string *)in,_S_ate);
  uVar2 = std::istream::tellg();
  auVar19._0_8_ = std::ifstream::~ifstream(&LFQ);
  auVar19._8_56_ = extraout_var;
  auVar21 = vcvtusi2sd_avx512f(auVar19._0_16_,uVar2);
  local_598 = auVar21._0_8_;
  auVar20._0_8_ = pow(local_598,0.66);
  auVar20._8_56_ = extraout_var_00;
  uVar3 = vcvttsd2usi_avx512f(auVar20._0_16_);
  uVar12 = 2;
  if (2 < uVar3) {
    uVar12 = uVar3;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"File size = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," characters");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"cut-off frequency = ");
  local_578 = (ulong)uVar12;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  skippable_text<unsigned_int,_unsigned_int>::skippable_text(&T,uVar2);
  std::operator<<((ostream *)&std::cout,"filling skippable text with text characters ... ");
  std::ostream::flush();
  iVar18 = 0;
  uVar13 = 0;
  uVar2 = T.max_symbol;
  while (T.max_symbol = uVar2, plVar5 = (long *)std::istream::get((char *)&ifs),
        (*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
    uVar2 = char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[(byte)c];
    if (uVar2 == 0xffffffff) {
      char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[(byte)c] = iVar18;
      LFQ.max_size = (itype)(byte)c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&A,&LFQ.max_size);
      iVar18 = iVar18 + 1;
      uVar2 = char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[(byte)c];
    }
    uVar15 = (ulong)((int)uVar13 + 1);
    T.T.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13] = (unsigned_short)uVar2;
    uVar13 = uVar15;
    if (uVar2 < T.max_symbol) {
      uVar2 = T.max_symbol;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"done. ");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"alphabet size is ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"initializing and sorting text positions vector ... ");
  std::ostream::flush();
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::text_positions
            (&TP,&T,uVar12);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "done. Number of text positions containing a high-frequency pair: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  X = iVar18;
  poVar4 = std::operator<<((ostream *)&std::cout,"\nSTEP 1. HIGH FREQUENCY PAIRS");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"inserting pairs in high-frequency queue ... ");
  std::ostream::flush();
  auVar22._8_56_ = extraout_var_01;
  auVar22._0_8_ = extraout_XMM1_Qa;
  local_4a8.H.null.P_ab = 0;
  local_4a8.H.null.L_ab = 0;
  local_4a8.H.null.F_ab = 0;
  local_4a8.H.blank = 0xffffffff;
  local_4a8.H.nullpair.first = 0xffffffff;
  local_4a8.H.nullpair.second = 0xffffffff;
  local_4a8.H.H.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.H.H.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.H.H.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.pairs_in_hash.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.pairs_in_hash.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.pairs_in_hash.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.current_size = 0;
  local_4a8.peak_size = 0;
  local_4a8.null = 0xffffffff;
  local_4a8.NULLPAIR.first = 0xffffffff;
  local_4a8.NULLPAIR.second = 0xffffffff;
  local_4a8.min_freq = 0;
  auVar23 = ZEXT1664(auVar22._0_16_);
  new_high_frequency_queue(&local_4a8,&TP,&T,local_578);
  poVar4 = std::operator<<((ostream *)&std::cout,"done. Number of distinct high-frequency pairs = ")
  ;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Replacing high-frequency pairs ... ");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar13 = 0;
  iVar14 = -1;
LAB_0010bb04:
  do {
    do {
      cVar6 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max
                        (&local_4a8);
      auVar21 = auVar23._0_16_;
      cVar1.second = local_4a8.NULLPAIR.second;
      cVar1.first = local_4a8.NULLPAIR.first;
      if (cVar6 == cVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"done. ");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"Peak queue size = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," (");
        auVar21 = vcvtusi2sd_avx512f(auVar21,local_4a8.peak_size);
        poVar4 = std::ostream::_M_insert<double>(auVar21._0_8_ / local_598);
        poVar4 = std::operator<<(poVar4,"n)");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"\nSTEP 2. LOW FREQUENCY PAIRS");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<((ostream *)&std::cout,"Re-computing TP array ... ");
        std::ostream::flush();
        text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::
        fill_with_text_positions(&TP);
        poVar4 = std::operator<<((ostream *)&std::cout,"done.");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<((ostream *)&std::cout,"Sorting  TP array ... ");
        std::ostream::flush();
        text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::cluster(&TP)
        ;
        poVar4 = std::operator<<((ostream *)&std::cout,"done.");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<((ostream *)&std::cout,"Counting low-frequency pairs ... ");
        std::ostream::flush();
        for (uVar13 = 1;
            uVar13 < ((ulong)((long)TP.TP.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)TP.TP.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
            uVar13 = uVar13 + 1) {
          skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                    (&T,TP.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar13]);
          skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                    (&T,TP.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar13 - 1]);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "done. Number of distict low-frequency pairs: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<((ostream *)&std::cout,"Filling low-frequency queue ... ");
        std::ostream::flush();
        auVar24._8_56_ = extraout_var_03;
        auVar24._0_8_ = extraout_XMM1_Qa_01;
        lf_queue<ll_el<unsigned_int,_unsigned_int>_>::lf_queue(&LFQ,uVar12 - 1);
        uVar13 = 1;
        uVar16 = uVar13;
        for (uVar15 = uVar13;
            uVar15 < ((ulong)((long)TP.TP.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)TP.TP.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
            uVar15 = uVar15 + 1) {
          cVar8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                            (&T,TP.TP.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar15]);
          cVar9 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                            (&T,TP.TP.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar15 - 1]);
          if (cVar8 == cVar9) {
            uVar10 = uVar16 + 1;
          }
          else {
            uVar10 = uVar13;
            if (1 < uVar16) {
              cVar8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                                (&T,TP.TP.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar15 - 1]);
              uStack_584 = (uint)uVar16;
              iStack_588 = (int)uVar15 - uStack_584;
              local_590 = cVar8.first;
              uStack_58c = cVar8.second;
              el.L_ab = uStack_584;
              el.P_ab = iStack_588;
              el.ab.first = cVar8.first;
              el.ab.second = cVar8.second;
              el.F_ab = uStack_584;
              local_580 = uStack_584;
              lf_queue<ll_el<unsigned_int,_unsigned_int>_>::insert(&LFQ,el);
            }
          }
          uVar16 = uVar10;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"done.");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"Replacing low-frequency pairs ... ");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar12 = T.non_blank_characters;
        iVar14 = -1;
        do {
          iVar17 = iVar14 + 4;
          do {
            cVar11 = lf_queue<ll_el<unsigned_int,_unsigned_int>_>::max(&LFQ);
            auVar21 = auVar24._0_16_;
            if (cVar11 == LFQ.NULLPAIR) {
              poVar4 = std::operator<<((ostream *)&std::cout,"done. ");
              std::endl<char,std::char_traits<char>>(poVar4);
              poVar4 = std::operator<<((ostream *)&std::cout,"Peak queue size = ");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::operator<<(poVar4," (");
              auVar21 = vcvtusi2sd_avx512f(auVar21,LFQ.peak_size);
              poVar4 = std::ostream::_M_insert<double>(auVar21._0_8_ / local_598);
              poVar4 = std::operator<<(poVar4,"n)");
              std::endl<char,std::char_traits<char>>(poVar4);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Compressing grammar and storing it to file ... ");
              poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
              std::endl<char,std::char_traits<char>>(poVar4);
              for (uVar12 = 0; uVar12 < T.n; uVar12 = uVar12 + 1) {
                if ((T.non_blank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12 >> 6] >>
                     ((ulong)(byte)~(byte)uVar12 & 0x3f) & 1) != 0) {
                  local_59c = skippable_text<unsigned_int,_unsigned_int>::at(&T,uVar12);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_int>(&T_vec,&local_59c);
                }
              }
              lf_queue<ll_el<unsigned_int,_unsigned_int>_>::~lf_queue(&LFQ);
              hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::~hf_queue
                        (&local_4a8);
              text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::
              ~text_positions(&TP);
              skippable_text<unsigned_int,_unsigned_int>::~skippable_text(&T);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&char_to_int.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
              std::ifstream::~ifstream(&ifs);
              return;
            }
            substitution_round<lf_queue<ll_el<unsigned_int,unsigned_int>>>(&LFQ,&TP,&T);
            iVar14 = 100 - (T.non_blank_characters * 100) / uVar12;
          } while (iVar14 <= iVar17);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar14);
          auVar24._8_56_ = extraout_var_04;
          auVar24._0_8_ = extraout_XMM1_Qa_02;
          poVar4 = std::operator<<(poVar4,"%");
          std::endl<char,std::char_traits<char>>(poVar4);
        } while( true );
      }
      uVar7 = substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                        (&local_4a8,&TP,&T);
      if (iVar14 == -1) {
        iVar14 = 0;
        uVar13 = uVar7;
        goto LAB_0010bb04;
      }
      iVar17 = 100 - (int)((uVar7 * 100) / uVar13);
    } while (iVar17 <= iVar14 + 4);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
    auVar23._8_56_ = extraout_var_02;
    auVar23._0_8_ = extraout_XMM1_Qa_00;
    poVar4 = std::operator<<(poVar4,"%");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar14 = iVar17;
  } while( true );
}

Assistant:

void compute_repair(string in){


	//packed_gamma_file2<> out_file(out);
	//packed_gamma_file2<> out_file(out);

	/*
	 * tradeoff between low-frequency and high-freq phase:
	 *
	 * - High-freq phase will use n^(2 - 2*alpha) words of memory and process approximately n^(1-alpha) pairs
	 *   alpha should satisfy 0.5 < alpha < 1
	 *
	 * - Low-freq phase will use n^alpha words of memory
	 *
	 */
	double alpha = 0.66; // = 2/3

	/*
	 * in the low-frequency pair processing phase, insert at most n/B elements in the hash
	 */
	uint64_t B = 50;

	itype n;
	itype sigma = 0; //alphabet size

	/*
	 * Pairs with frequency greater than or equal to min_high_frequency are inserted in high-freq queue
	 */
	itype min_high_frequency = 0;
	itype lf_queue_capacity = 0;

	/*
	 * (1) INITIALIZE DATA STRUCTURES
	 */

	const itype null = ~itype(0);

	ifstream ifs(in);

	vector<itype> char_to_int(256,null);

	//count file size
	{
		ifstream file(in,ios::ate);
		n = file.tellg();
	}

	min_high_frequency = std::pow(  n, alpha  );// n^(alpha)

	min_high_frequency = min_high_frequency <2 ? 2 : min_high_frequency;

	cout << "File size = " << n << " characters"  << endl;
	cout << "cut-off frequency = " << min_high_frequency  << endl;

	itype width = 64 - __builtin_clzll(uint64_t(n));

	//largest possible high-frequency dictionary symbol
	//at most max_d <= n high-freq dictionary symbols can be created; given that min. freq of
	//a high-freq dictionary symbol is f=min_high_frequency and that every new dictionary symbol
	//introduces a blank in the text, we have the inequality max_d * f <= n  <=> max_d <= n/f
	itype max_d = 256+n/min_high_frequency;

	//cout << "Max high-frequency dictionary symbol = " << max_d << endl << endl;

	//initialize text and text positions
	text_t T(n);

	itype j = 0;

	cout << "filling skippable text with text characters ... " << flush;

	char c;

	while(ifs.get(c)){

		if(char_to_int[uint8_t(c)] == null){

			char_to_int[uint8_t(c)] = sigma;
			A.push_back(uint8_t(c));
			sigma++;

		}

		T.set(j++,char_to_int[uint8_t(c)]);

	}

	cout << "done. " << endl << endl;

	cout << "alphabet size is " << sigma  << endl << endl;

	cout << "initializing and sorting text positions vector ... " << flush;

	TP_t TP(&T,min_high_frequency);

	cout << "done. Number of text positions containing a high-frequency pair: " << TP.size() << endl;

	//next free dictionary symbol = sigma
	X =  sigma;

	cout << "\nSTEP 1. HIGH FREQUENCY PAIRS" << endl << endl;

	cout << "inserting pairs in high-frequency queue ... " << flush;

	hf_q_t HFQ;
	new_high_frequency_queue(HFQ, TP, T, min_high_frequency);

	cout << "done. Number of distinct high-frequency pairs = " << HFQ.size() << endl;

	cout << "Replacing high-frequency pairs ... " << endl;

	int last_perc = -1;
	uint64_t F = 0;//largest freq

	while(HFQ.max() != HFQ.nullpair()){

		auto f = substitution_round<hf_q_t>(HFQ, TP, T);

		if(last_perc == -1){

			F = f;

			last_perc = 0;

		}else{

			int perc = 100-(100*f)/F;

			if(perc > last_perc+4){

				last_perc = perc;
				cout << perc << "%" << endl;

			}

		}

	}

	cout << "done. " << endl;
	cout << "Peak queue size = " << HFQ.peak() << " (" << double(HFQ.peak())/double(n) << "n)" << endl;

	cout << "\nSTEP 2. LOW FREQUENCY PAIRS" << endl << endl;

	cout << "Re-computing TP array ... " << flush;

	//T.compact(); //remove blank positions
	TP.fill_with_text_positions(); //store here all remaining text positions

	cout << "done." << endl;

	cout << "Sorting  TP array ... " << flush;
	TP.cluster(); //cluster text positions by character pairs
	cout << "done." << endl;


	cout << "Counting low-frequency pairs ... " << flush;
	/*
	 * scan sorted array of text positions and count frequencies
	 *
	 * in this phase, all pairs have frequency < min_high_frequency
	 *
	 * after counting, frequencies[f] is the number of pairs with frequency equal to f
	 *
	 */
	//auto frequencies = vector<uint64_t>(min_high_frequency,0);
	uint64_t n_lf_pairs = 0; //number of low-frequency pairs

	uint64_t f = 1;
	for(uint64_t i=1;i<TP.size();++i){

		if(T.pair_starting_at(TP[i]) == T.pair_starting_at(TP[i-1])){

			f++;

		}else{

			f=1;
			n_lf_pairs++;

		}

	}
	cout << "done. Number of distict low-frequency pairs: "<< n_lf_pairs << endl;

	cout << "Filling low-frequency queue ... " << flush;

	lf_q_t LFQ(min_high_frequency-1);

	f = 1;

	using el_t = lf_q_t::el_type;

	for(uint64_t i=1;i<TP.size();++i){

		if(T.pair_starting_at(TP[i]) == T.pair_starting_at(TP[i-1])){

			f++;

		}else{

			if(f>1){

				cpair ab = T.pair_starting_at(TP[i-1]);

				assert(i>=f);
				itype P_ab = i - f;

				itype L_ab = f;

				itype F_ab = f;

				el_t el = {ab,P_ab,L_ab,F_ab};

				LFQ.insert(el);

			}

			f=1;

		}

	}

	cout << "done." << endl;

	cout << "Replacing low-frequency pairs ... " << endl;

	pair<itype,itype> replaced = {0,0};

	last_perc = -1;
	uint64_t tl = T.number_of_non_blank_characters();

	while(LFQ.max() != LFQ.nullpair()){

		auto f = substitution_round<lf_q_t>(LFQ, TP, T);

		int perc = 100-(100*T.number_of_non_blank_characters())/tl;

		if(perc>last_perc+4){

			last_perc = perc;

			cout << perc << "%" << endl;

		}

	}

	cout << "done. " << endl;
	cout << "Peak queue size = " << LFQ.peak() << " (" << double(LFQ.peak())/double(n) << "n)" << endl;

	cout << "Compressing grammar and storing it to file ... " << endl << endl;

	for(itype i=0;i<T.size();++i){

		if(not T.is_blank(i)) T_vec.push_back(T[i]);

	}

}